

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_237::FindingApplier::handleRefinement(FindingApplier *this,Expression *curr)

{
  bool bVar1;
  Index index;
  Function *func;
  pointer ppVar2;
  reference ppLVar3;
  Module *wasm;
  LocalSet *expression;
  Builder local_68;
  LocalGet *local_60;
  LocalGet *get;
  iterator __end2;
  iterator __begin2;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *__range2;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *gets;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  _Stack_28;
  Index var;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  local_20;
  iterator iter;
  Expression *curr_local;
  FindingApplier *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
               )curr;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>_>
       ::find(&this->finder->lessCastedGets,(key_type *)&iter);
  _Stack_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>_>
       ::end(&this->finder->lessCastedGets);
  bVar1 = std::__detail::operator==(&local_20,&stack0xffffffffffffffd8);
  if (!bVar1) {
    func = Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
           ::getFunction((Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                          *)this);
    index = Builder::addVar(func,(Type)*(uintptr_t *)
                                        ((long)iter.
                                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                                               ._M_cur + 8));
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false,_false>
                           *)&local_20);
    __end2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin
                       (&ppVar2->second);
    get = (LocalGet *)
          std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end(&ppVar2->second);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                       *)&get), bVar1) {
      ppLVar3 = __gnu_cxx::
                __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                ::operator*(&__end2);
      local_60 = *ppLVar3;
      local_60->index = index;
      (local_60->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           *(uintptr_t *)
            ((long)iter.
                   super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                   ._M_cur + 8);
      __gnu_cxx::
      __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
      ::operator++(&__end2);
    }
    wasm = Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                        *)this);
    Builder::Builder(&local_68,wasm);
    expression = Builder::makeLocalTee
                           (&local_68,index,
                            (Expression *)
                            iter.
                            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                            ._M_cur,(Type)*(uintptr_t *)
                                           ((long)iter.
                                                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                                                  ._M_cur + 8));
    Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
    ::replaceCurrent((Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                      *)this,(Expression *)expression);
  }
  return;
}

Assistant:

void handleRefinement(Expression* curr) {
    auto iter = finder.lessCastedGets.find(curr);
    if (iter == finder.lessCastedGets.end()) {
      return;
    }

    // This expression was the best cast for some gets. Add a new local to
    // store this value, then use it for the gets.
    auto var = Builder::addVar(getFunction(), curr->type);
    auto& gets = iter->second;
    for (auto* get : gets) {
      get->index = var;
      get->type = curr->type;
    }

    // Replace ourselves with a tee.
    replaceCurrent(Builder(*getModule()).makeLocalTee(var, curr, curr->type));
  }